

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_71ad4a::cmStringSorter::operator()(cmStringSorter *this,string *a,string *b)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  string *psVar3;
  string bf;
  string af;
  string local_60;
  string local_40;
  
  ApplyFilter(&local_40,this,a);
  ApplyFilter(&local_60,this,b);
  if ((this->sortMethod).super__Function_base._M_manager == (_Manager_type)0x0) {
    std::__throw_bad_function_call();
  }
  psVar3 = &local_40;
  pbVar1 = &local_60;
  if (this->descending != false) {
    psVar3 = &local_60;
    pbVar1 = &local_40;
  }
  bVar2 = (*(this->sortMethod)._M_invoker)((_Any_data *)&this->sortMethod,psVar3,pbVar1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool operator()(const std::string& a, const std::string& b)
  {
    std::string af = this->ApplyFilter(a);
    std::string bf = this->ApplyFilter(b);
    bool result;
    if (this->descending) {
      result = this->sortMethod(bf, af);
    } else {
      result = this->sortMethod(af, bf);
    }
    return result;
  }